

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<5,_2,_3>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  undefined8 uVar1;
  int row_1;
  bool bVar2;
  int row;
  long lVar3;
  float *pfVar4;
  long lVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  bool bVar12;
  Matrix<float,_3,_2> retVal;
  Type in1;
  Matrix<float,_2,_3> res;
  float local_10 [4];
  long lVar11;
  
  uVar1 = *(undefined8 *)(evalCtx->coords).m_data;
  fVar7 = SUB84(uVar1,4);
  if (in0Type != INPUTTYPE_DYNAMIC) {
    fVar7 = 0.5;
  }
  fVar6 = (float)uVar1;
  if (in0Type != INPUTTYPE_DYNAMIC) {
    fVar6 = 1.2;
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    in1.m_data[0] = (float)uVar1;
    in1.m_data[1] = SUB84(uVar1,4);
    in1.m_data[2] = (evalCtx->coords).m_data[2];
  }
  else {
    in1.m_data[0] = -0.2;
    in1.m_data[1] = 0.5;
    in1.m_data[2] = 0.8;
  }
  retVal.m_data.m_data[0].m_data[0] = 0.0;
  retVal.m_data.m_data[0].m_data[1] = 0.0;
  retVal.m_data.m_data[0].m_data[2] = 0.0;
  retVal.m_data.m_data[1].m_data[0] = 0.0;
  retVal.m_data.m_data[1].m_data[1] = 0.0;
  retVal.m_data.m_data[1].m_data[2] = 0.0;
  lVar3 = 0;
  do {
    fVar9 = 1.0;
    fVar8 = fVar9;
    if (lVar3 != 0) {
      fVar8 = 0.0;
    }
    retVal.m_data.m_data[0].m_data[lVar3] = fVar8;
    if (lVar3 != 1) {
      fVar9 = 0.0;
    }
    retVal.m_data.m_data[1].m_data[lVar3] = fVar9;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  lVar3 = 0;
  do {
    fVar8 = in1.m_data[lVar3];
    retVal.m_data.m_data[0].m_data[lVar3] = fVar6 * fVar8;
    retVal.m_data.m_data[1].m_data[lVar3] = fVar8 * fVar7;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  lVar3 = 0;
  pfVar4 = (float *)&res;
  bVar12 = true;
  do {
    bVar2 = bVar12;
    lVar5 = 0;
    auVar10 = _DAT_00ac4b30;
    do {
      bVar12 = SUB164(auVar10 ^ _DAT_00ac4b80,4) == -0x80000000 &&
               SUB164(auVar10 ^ _DAT_00ac4b80,0) < -0x7ffffffd;
      if (bVar12) {
        fVar7 = 1.0;
        if (lVar3 != lVar5) {
          fVar7 = 0.0;
        }
        pfVar4[lVar5 * 2] = fVar7;
      }
      if (bVar12) {
        fVar7 = 1.0;
        if (lVar3 + -1 != lVar5) {
          fVar7 = 0.0;
        }
        pfVar4[lVar5 * 2 + 2] = fVar7;
      }
      lVar5 = lVar5 + 2;
      lVar11 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 2;
      auVar10._8_8_ = lVar11 + 2;
    } while (lVar5 != 4);
    lVar3 = 1;
    pfVar4 = res.m_data.m_data[0].m_data + 1;
    bVar12 = false;
  } while (bVar2);
  lVar3 = 0;
  do {
    fVar7 = retVal.m_data.m_data[1].m_data[lVar3];
    res.m_data.m_data[lVar3].m_data[0] = retVal.m_data.m_data[0].m_data[lVar3];
    res.m_data.m_data[lVar3].m_data[1] = fVar7;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  retVal.m_data.m_data[0].m_data[2] = 0.0;
  retVal.m_data.m_data[1].m_data[0] = 1.4013e-45;
  retVal.m_data.m_data[1].m_data[1] = 2.8026e-45;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[(int)retVal.m_data.m_data[0].m_data[lVar3]] = local_10[lVar3 + -2];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(outerProduct(in0, in1));
	}